

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_encoding
pugi::impl::anon_unknown_0::get_buffer_encoding(xml_encoding encoding,void *contents,size_t size)

{
  bool bVar1;
  uint8_t *data;
  size_t size_local;
  void *contents_local;
  xml_encoding encoding_local;
  
  if (encoding == encoding_wchar) {
    contents_local._4_4_ = get_wchar_encoding();
  }
  else if (encoding == encoding_utf16) {
    bVar1 = is_little_endian();
    contents_local._4_4_ = encoding_utf16_be;
    if (bVar1) {
      contents_local._4_4_ = encoding_utf16_le;
    }
  }
  else if (encoding == encoding_utf32) {
    bVar1 = is_little_endian();
    contents_local._4_4_ = encoding_utf32_be;
    if (bVar1) {
      contents_local._4_4_ = encoding_utf32_le;
    }
  }
  else {
    contents_local._4_4_ = encoding;
    if (encoding == encoding_auto) {
      contents_local._4_4_ = guess_buffer_encoding((uint8_t *)contents,size);
    }
  }
  return contents_local._4_4_;
}

Assistant:

PUGI__FN xml_encoding get_buffer_encoding(xml_encoding encoding, const void* contents, size_t size)
	{
		// replace wchar encoding with utf implementation
		if (encoding == encoding_wchar) return get_wchar_encoding();

		// replace utf16 encoding with utf16 with specific endianness
		if (encoding == encoding_utf16) return is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

		// replace utf32 encoding with utf32 with specific endianness
		if (encoding == encoding_utf32) return is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

		// only do autodetection if no explicit encoding is requested
		if (encoding != encoding_auto) return encoding;

		// try to guess encoding (based on XML specification, Appendix F.1)
		const uint8_t* data = static_cast<const uint8_t*>(contents);

		return guess_buffer_encoding(data, size);
	}